

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vhost.c
# Opt level: O3

void * lws_protocol_vh_priv_zalloc(lws_vhost *vhost,lws_protocols *prot,int size)

{
  int iVar1;
  char *__s2;
  int iVar2;
  void **ppvVar3;
  lws_protocols *plVar4;
  void *pvVar5;
  ulong uVar6;
  ulong uVar7;
  
  if (vhost->protocol_vh_privs == (void **)0x0) {
    ppvVar3 = (void **)lws_zalloc((long)vhost->count_protocols << 3,"protocol_vh_privs");
    vhost->protocol_vh_privs = ppvVar3;
    if (ppvVar3 != (void **)0x0) goto LAB_0011180a;
LAB_00111884:
    pvVar5 = (void *)0x0;
  }
  else {
LAB_0011180a:
    iVar1 = vhost->count_protocols;
    uVar6 = (ulong)iVar1;
    if ((long)uVar6 < 1) {
      uVar7 = 0;
LAB_0011183a:
      if ((int)uVar7 == iVar1) goto LAB_0011183f;
    }
    else {
      plVar4 = vhost->protocols + -1;
      uVar7 = 0;
      do {
        plVar4 = plVar4 + 1;
        if (plVar4 == prot) goto LAB_0011183a;
        uVar7 = uVar7 + 1;
      } while (uVar6 != uVar7);
LAB_0011183f:
      if (iVar1 < 1) {
        uVar7 = 0;
      }
      else {
        plVar4 = vhost->protocols;
        __s2 = prot->name;
        uVar7 = 0;
        while (iVar2 = strcmp(plVar4->name,__s2), iVar2 != 0) {
          uVar7 = uVar7 + 1;
          plVar4 = plVar4 + 1;
          if (uVar6 == uVar7) {
            return (void *)0x0;
          }
        }
      }
      if ((int)uVar7 == iVar1) goto LAB_00111884;
    }
    pvVar5 = lws_zalloc((long)size,"vh priv");
    vhost->protocol_vh_privs[uVar7 & 0xffffffff] = pvVar5;
    pvVar5 = vhost->protocol_vh_privs[uVar7 & 0xffffffff];
  }
  return pvVar5;
}

Assistant:

void *
lws_protocol_vh_priv_zalloc(struct lws_vhost *vhost,
			    const struct lws_protocols *prot, int size)
{
	int n = 0;

	/* allocate the vh priv array only on demand */
	if (!vhost->protocol_vh_privs) {
		vhost->protocol_vh_privs = (void **)lws_zalloc(
				vhost->count_protocols * sizeof(void *),
				"protocol_vh_privs");
		if (!vhost->protocol_vh_privs)
			return NULL;
	}

	while (n < vhost->count_protocols && &vhost->protocols[n] != prot)
		n++;

	if (n == vhost->count_protocols) {
		n = 0;
		while (n < vhost->count_protocols &&
		       strcmp(vhost->protocols[n].name, prot->name))
			n++;

		if (n == vhost->count_protocols)
			return NULL;
	}

	vhost->protocol_vh_privs[n] = lws_zalloc(size, "vh priv");
	return vhost->protocol_vh_privs[n];
}